

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O1

void * aom_malloc(size_t size)

{
  void *pvVar1;
  void *pvVar2;
  
  if (0x1ffffffe9 < size) {
    return (void *)0x0;
  }
  pvVar1 = malloc(size + 0x17);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)((long)pvVar1 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar2 - 8) = pvVar1;
  }
  return pvVar2;
}

Assistant:

void *aom_malloc(size_t size) { return aom_memalign(DEFAULT_ALIGNMENT, size); }